

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,float power)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ImGuiDataTypeInfo *pIVar4;
  ImVec2 *text_size_if_known;
  int in_ESI;
  char *in_R9;
  float fVar5;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool clicked;
  bool focus_requested;
  bool temp_input_start;
  bool temp_input_is_active;
  bool hovered;
  ImRect total_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe28;
  char *p_data_00;
  ImRect *in_stack_fffffffffffffe30;
  ulong uVar6;
  ImRect *in_stack_fffffffffffffe38;
  float *buf;
  ImVec2 *in_stack_fffffffffffffe40;
  undefined1 *puVar7;
  ImGuiWindow *in_stack_fffffffffffffe48;
  ImGuiWindow *in_stack_fffffffffffffe50;
  ImGuiWindow *in_stack_fffffffffffffe58;
  ImVec2 *pIVar8;
  undefined8 in_stack_fffffffffffffe60;
  ImGuiID id_00;
  ImDrawList *in_stack_fffffffffffffe68;
  undefined1 hide_text_after_hash;
  float *in_stack_fffffffffffffe70;
  ImVec2 *in_stack_fffffffffffffe78;
  float fVar9;
  float in_stack_fffffffffffffe84;
  ImGuiDataType in_stack_fffffffffffffe90;
  ImVec2 p_max_00;
  ImVec2 IVar10;
  ImGuiID id_01;
  ImRect *bb;
  ImVec2 in_stack_fffffffffffffec0;
  ImVec2 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  ImRect *in_stack_fffffffffffffee0;
  float local_d8 [2];
  ImVec2 local_d0 [3];
  ImU32 local_b4;
  byte local_ad;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  byte local_a9;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImRect local_98;
  undefined1 local_88 [8];
  ImVec2 local_80;
  ImRect local_78;
  ImVec2 local_68;
  float local_60;
  ImGuiID local_5c;
  ImGuiStyle *local_58;
  ImGuiContext *local_50;
  ImGuiWindow *local_48;
  char *local_38;
  int local_14;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_38 = in_R9;
  local_14 = in_ESI;
  local_48 = GetCurrentWindow();
  if ((local_48->SkipItems & 1U) == 0) {
    local_50 = GImGui;
    local_58 = &GImGui->Style;
    p_max_00.x = 0.0;
    p_max_00.y = 0.0;
    local_5c = ImGuiWindow::GetID(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                                  (char *)in_stack_fffffffffffffe40);
    local_60 = CalcItemWidth();
    local_68 = CalcTextSize((char *)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                            SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe48,0));
    pIVar8 = &(local_48->DC).CursorPos;
    fVar5 = (local_58->FramePadding).y;
    IVar10 = (ImVec2)local_88;
    ImVec2::ImVec2((ImVec2 *)IVar10,local_60,fVar5 + fVar5 + local_68.y);
    local_80 = operator+(in_stack_fffffffffffffe28,(ImVec2 *)0x1c7e0e);
    ImRect::ImRect(&local_78,pIVar8,&local_80);
    id_01 = (ImGuiID)((ulong)pIVar8 >> 0x20);
    bb = &local_78;
    iVar3 = (int)&local_78 + 8;
    if (local_68.x <= 0.0) {
      fVar5 = 0.0;
    }
    else {
      fVar5 = (local_58->ItemInnerSpacing).x + local_68.x;
    }
    pIVar8 = &local_a8;
    ImVec2::ImVec2(pIVar8,fVar5,0.0);
    local_a0 = operator+(in_stack_fffffffffffffe28,(ImVec2 *)0x1c7ebf);
    fVar9 = (float)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    ImRect::ImRect(&local_98,&bb->Min,&local_a0);
    ItemSize(in_stack_fffffffffffffe30,fVar9);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe58,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe48);
    if (bVar1) {
      if (local_38 == (char *)0x0) {
        pIVar4 = DataTypeGetInfo(0);
        local_38 = pIVar4->PrintFmt;
      }
      else if ((local_14 == 4) && (iVar2 = strcmp(local_38,"%d"), iVar2 != 0)) {
        local_38 = PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffe38);
      }
      local_a9 = ItemHoverable(in_stack_fffffffffffffe38,
                               (ImGuiID)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      local_aa = TempInputIsActive(local_5c);
      local_ab = 0;
      if (!(bool)local_aa) {
        local_ac = FocusableItemRegister
                             (in_stack_fffffffffffffe48,
                              (ImGuiID)((ulong)in_stack_fffffffffffffe40 >> 0x20));
        fVar9 = (float)((uint)in_stack_fffffffffffffe84 & 0xffffff);
        if ((local_a9 & 1) != 0) {
          fVar9 = (float)CONCAT13((local_50->IO).MouseClicked[0],SUB43(in_stack_fffffffffffffe84,0))
          ;
        }
        in_stack_fffffffffffffe84 = fVar9;
        local_ad = (byte)((uint)in_stack_fffffffffffffe84 >> 0x18) & 1;
        if (((((bool)local_ac) || (((uint)in_stack_fffffffffffffe84 & 0x1000000) != 0)) ||
            (local_50->NavActivateId == local_5c)) || (local_50->NavInputId == local_5c)) {
          SetActiveID(local_5c,local_48);
          SetFocusID(id_00,in_stack_fffffffffffffe58);
          FocusWindow(in_stack_fffffffffffffe50);
          local_50->ActiveIdUsingNavDirMask = local_50->ActiveIdUsingNavDirMask | 3;
          if ((((local_ac & 1) != 0) ||
              (((local_ad & 1) != 0 && (((local_50->IO).KeyCtrl & 1U) != 0)))) ||
             (local_50->NavInputId == local_5c)) {
            local_ab = 1;
            FocusableItemUnregister(local_48);
          }
        }
      }
      if (((local_aa & 1) == 0) && ((local_ab & 1) == 0)) {
        if (local_50->ActiveId == local_5c) {
          fVar9 = 1.26117e-44;
        }
        else {
          fVar9 = 9.80909e-45;
          if (local_50->HoveredId == local_5c) {
            fVar9 = 1.12104e-44;
          }
        }
        local_b4 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                               SUB84(in_stack_fffffffffffffe40,0));
        RenderNavHighlight(in_stack_fffffffffffffee0,(ImGuiID)in_stack_fffffffffffffedc,
                           (ImGuiNavHighlightFlags)in_stack_fffffffffffffed8);
        RenderFrame(IVar10,p_max_00,(ImU32)fVar5,SUB41((uint)in_stack_fffffffffffffe90 >> 0x18,0),
                    (float)((ulong)pIVar8 >> 0x20));
        ImRect::ImRect(in_stack_fffffffffffffe30);
        buf = local_d8;
        uVar6 = (ulong)in_stack_fffffffffffffe30 & 0xffffffff00000000;
        p_data_00 = local_38;
        bVar1 = SliderBehavior((ImRect *)p_max_00,(ImGuiID)fVar5,in_stack_fffffffffffffe90,pIVar8,
                               (void *)CONCAT44(in_stack_fffffffffffffe84,fVar9),
                               in_stack_fffffffffffffe78,(char *)bb,
                               (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),iVar3,
                               (ImRect *)in_stack_fffffffffffffec0);
        if (bVar1) {
          MarkItemEdited((ImGuiID)(uVar6 >> 0x20));
        }
        if (local_d8[0] < local_d0[0].x) {
          in_stack_fffffffffffffe68 = local_48->DrawList;
          in_stack_fffffffffffffe70 = local_d8;
          in_stack_fffffffffffffe78 = local_d0;
          GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                      SUB84(in_stack_fffffffffffffe40,0));
          ImDrawList::AddRectFilled
                    ((ImDrawList *)in_stack_fffffffffffffe50,(ImVec2 *)in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe40,(ImU32)((ulong)buf >> 0x20),SUB84(buf,0),
                     (ImDrawCornerFlags)(uVar6 >> 0x20));
        }
        puVar7 = &stack0xfffffffffffffed8;
        iVar3 = DataTypeFormatString
                          ((char *)buf,(int)(uVar6 >> 0x20),(ImGuiDataType)uVar6,p_data_00,
                           (char *)0x1c83a0);
        text_size_if_known = (ImVec2 *)(puVar7 + iVar3);
        pIVar8 = (ImVec2 *)&stack0xfffffffffffffed8;
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec8,0.5,0.5);
        RenderTextClipped((ImVec2 *)CONCAT44(in_stack_fffffffffffffe84,fVar9),
                          in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                          (char *)in_stack_fffffffffffffe68,text_size_if_known,pIVar8,
                          (ImRect *)CONCAT44(fVar5,in_stack_fffffffffffffe90));
        hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
        local_1 = bVar1;
        if (0.0 < local_68.x) {
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec0,
                         local_78.Max.x + (local_58->ItemInnerSpacing).x,
                         local_78.Min.y + (local_58->FramePadding).y);
          IVar10.y = in_stack_fffffffffffffe84;
          IVar10.x = fVar9;
          RenderText(IVar10,(char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                     (bool)hide_text_after_hash);
        }
      }
      else {
        local_1 = TempInputScalar(bb,id_01,(char *)IVar10,(ImGuiDataType)p_max_00.y,
                                  (void *)CONCAT44(fVar5,in_stack_fffffffffffffe90),(char *)pIVar8,
                                  (void *)in_stack_fffffffffffffec0,
                                  (void *)in_stack_fffffffffffffec8);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Slider turns it into an input box
    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = TempInputIsActive(id);
    bool temp_input_start = false;
    if (!temp_input_is_active)
    {
        const bool focus_requested = FocusableItemRegister(window, id);
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        if (focus_requested || clicked || g.NavActivateId == id || g.NavInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
            if (focus_requested || (clicked && g.IO.KeyCtrl) || g.NavInputId == id)
            {
                temp_input_start = true;
                FocusableItemUnregister(window);
            }
        }
    }

    // Our current specs do NOT clamp when using CTRL+Click manual input, but we should eventually add a flag for that..
    if (temp_input_is_active || temp_input_start)
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format);// , p_min, p_max);

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, power, ImGuiSliderFlags_None, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.x > grab_bb.Min.x)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f,0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return value_changed;
}